

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

AggregateFunction * duckdb::ScalarDiscreteQuantile::GetFallback(LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  aggregate_combine_t unaff_retaddr;
  aggregate_finalize_t in_stack_00000008;
  aggregate_simple_update_t in_stack_00000010;
  bind_aggregate_function_t in_stack_00000018;
  aggregate_destructor_t in_stack_00000020;
  aggregate_statistics_t in_stack_00000028;
  aggregate_window_t in_stack_00000030;
  aggregate_serialize_t in_stack_00000038;
  aggregate_deserialize_t in_stack_00000040;
  AggregateFunction *fun;
  allocator_type *in_stack_fffffffffffffee8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffef0;
  iterator in_stack_fffffffffffffef8;
  size_type in_stack_ffffffffffffff00;
  LogicalType *local_98;
  aggregate_update_t in_stack_ffffffffffffff98;
  LogicalType *this;
  aggregate_size_t in_stack_ffffffffffffffa8;
  LogicalType *in_stack_ffffffffffffffb0;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffb8;
  AggregateFunction *this_00;
  
  this = (LogicalType *)&stack0xffffffffffffffa8;
  duckdb::LogicalType::LogicalType(this,in_RSI);
  this_00 = (AggregateFunction *)&stack0xffffffffffffffa8;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x9f5b32);
  iVar1._M_len = in_stack_ffffffffffffff00;
  iVar1._M_array = in_stack_fffffffffffffef8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffef0,iVar1,in_stack_fffffffffffffee8);
  AggregateFunction::AggregateFunction
            (this_00,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (aggregate_initialize_t)this,in_stack_ffffffffffffff98,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x9f5bf5);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x9f5c02);
  local_98 = (LogicalType *)&stack0xffffffffffffffc0;
  do {
    local_98 = local_98 + -0x18;
    duckdb::LogicalType::~LogicalType(local_98);
  } while (local_98 != (LogicalType *)&stack0xffffffffffffffa8);
  return in_RDI;
}

Assistant:

static AggregateFunction GetFallback(const LogicalType &type) {
		using STATE = QuantileState<string_t, QuantileStringType>;
		using OP = QuantileScalarFallback;

		AggregateFunction fun({type}, type, AggregateFunction::StateSize<STATE>,
		                      AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
		                      AggregateSortKeyHelpers::UnaryUpdate<STATE, OP>,
		                      AggregateFunction::StateCombine<STATE, OP>,
		                      AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, nullptr,
		                      AggregateFunction::StateDestroy<STATE, OP>);
		return fun;
	}